

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::ByteSizeLong
          (TreeEnsembleParameters_TreeNode *this)

{
  bool bVar1;
  uint uVar2;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior TVar3;
  int iVar4;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *value;
  size_t sVar5;
  uint64 uVar6;
  double dVar7;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  TreeEnsembleParameters_TreeNode *this_local;
  
  uVar2 = evaluationinfo_size(this);
  _i = (ulong)uVar2 * 2;
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    value = evaluationinfo(this,local_20);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                      (value);
    _i = sVar5 + _i;
  }
  uVar6 = treeid(this);
  if (uVar6 != 0) {
    uVar6 = treeid(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  uVar6 = nodeid(this);
  if (uVar6 != 0) {
    uVar6 = nodeid(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  TVar3 = nodebehavior(this);
  if (TVar3 != TreeEnsembleParameters_TreeNode_TreeNodeBehavior_BranchOnValueLessThanEqual) {
    TVar3 = nodebehavior(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(TVar3);
    _i = sVar5 + 1 + _i;
  }
  bVar1 = missingvaluetrackstruechild(this);
  if (bVar1) {
    _i = _i + 2;
  }
  uVar6 = branchfeatureindex(this);
  if (uVar6 != 0) {
    uVar6 = branchfeatureindex(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  dVar7 = branchfeaturevalue(this);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    _i = _i + 9;
  }
  uVar6 = truechildnodeid(this);
  if (uVar6 != 0) {
    uVar6 = truechildnodeid(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  uVar6 = falsechildnodeid(this);
  if (uVar6 != 0) {
    uVar6 = falsechildnodeid(this);
    sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    _i = sVar5 + 1 + _i;
  }
  dVar7 = relativehitrate(this);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    _i = _i + 10;
  }
  iVar4 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar4;
  return _i;
}

Assistant:

size_t TreeEnsembleParameters_TreeNode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  {
    unsigned int count = this->evaluationinfo_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->evaluationinfo(i));
    }
  }

  // uint64 treeId = 1;
  if (this->treeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->treeid());
  }

  // uint64 nodeId = 2;
  if (this->nodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->nodeid());
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->nodebehavior() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->nodebehavior());
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->missingvaluetrackstruechild() != 0) {
    total_size += 1 + 1;
  }

  // uint64 branchFeatureIndex = 10;
  if (this->branchfeatureindex() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->branchfeatureindex());
  }

  // double branchFeatureValue = 11;
  if (this->branchfeaturevalue() != 0) {
    total_size += 1 + 8;
  }

  // uint64 trueChildNodeId = 12;
  if (this->truechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->truechildnodeid());
  }

  // uint64 falseChildNodeId = 13;
  if (this->falsechildnodeid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->falsechildnodeid());
  }

  // double relativeHitRate = 30;
  if (this->relativehitrate() != 0) {
    total_size += 2 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}